

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O1

void bsp_set_tagsize(bsp_size_t *tag_nbytes)

{
  int iVar1;
  size_t sVar2;
  Bsmp *pBVar3;
  
  if ((s_spmd == (Spmd *)0x0) || (s_spmd->m_closed == true)) {
    bsp_abort("bsp_set_tagsize: can only be called within SPMD section\n");
  }
  if (tag_nbytes == (bsp_size_t *)0x0) {
    bsp_abort("bsp_set_tagsize: NULL ptr as argument is now allowed\n");
  }
  if (*tag_nbytes < 0) {
    bsp_abort("bsp_set_tagsize: Tag size may not be negative\n");
  }
  pBVar3 = s_bsmp;
  iVar1 = *tag_nbytes;
  s_bsmp->m_send_empty = false;
  pBVar3->m_set_tag_size_counter = pBVar3->m_set_tag_size_counter + 1;
  sVar2 = pBVar3->m_next_tag_size;
  pBVar3->m_next_tag_size = (long)iVar1;
  *tag_nbytes = (bsp_size_t)sVar2;
  return;
}

Assistant:

void bsp_set_tagsize( bsp_size_t * tag_nbytes )
{
    if (!s_spmd || s_spmd->closed())
        bsp_abort("bsp_set_tagsize: can only be called within SPMD section\n");

    if (tag_nbytes == NULL)
        bsp_abort("bsp_set_tagsize: NULL ptr as argument is now allowed\n");

    if (*tag_nbytes < 0 )
        bsp_abort("bsp_set_tagsize: Tag size may not be negative\n");

    *tag_nbytes = static_cast<bsp_size_t>(s_bsmp->set_tag_size( *tag_nbytes ));
}